

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test.cpp
# Opt level: O1

void __thiscall
UniversalTest_SingleUniversal_Test_Test::TestBody(UniversalTest_SingleUniversal_Test_Test *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  unsigned_long __res;
  ulong uVar5;
  int *__s;
  result_type rVar6;
  ostream *poVar7;
  HeapType HVar8;
  size_t __i;
  long lVar9;
  value_type_conflict1 *__val;
  char *in_R9;
  AssertionResult gtest_ar_;
  FoolHeapList fool;
  HeapList tested;
  mt19937 generator;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1440;
  internal local_1438 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1430;
  HeapType local_1424;
  string local_1420;
  AssertHelper local_1400;
  HeapList local_13f8;
  HeapList local_13d8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  local_13b8._M_x[0] = time((time_t *)0x0);
  local_13b8._M_x[0] = local_13b8._M_x[0] & 0xffffffff;
  lVar9 = 1;
  uVar5 = local_13b8._M_x[0];
  do {
    uVar5 = (ulong)(((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar9);
    local_13b8._M_x[lVar9] = uVar5;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x270);
  local_13b8._M_p = 0x270;
  __s = (int *)operator_new(4000000);
  lVar9 = 0;
  memset(__s,0,4000000);
  do {
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&local_13b8);
    __s[lVar9] = (int)rVar6;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 1000000);
  HVar8 = Binomial;
  do {
    local_13d8.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_13d8.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_13d8.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_13f8.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_13f8.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_13f8.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_13f8.TYPE = Fool;
    local_1424 = HVar8;
    local_13d8.TYPE = HVar8;
    HeapList::AddHeap(&local_13d8,*__s);
    HeapList::AddHeap(&local_13f8,*__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Size ",5);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    lVar9 = 1;
    do {
      (**(*local_13d8.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
           super__Vector_impl_data._M_start)->_vptr_IHeap)
                (*local_13d8.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
                  super__Vector_impl_data._M_start,(ulong)(uint)__s[lVar9]);
      (**(*local_13f8.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
           super__Vector_impl_data._M_start)->_vptr_IHeap)();
      iVar2 = (*(*local_13d8.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
                  super__Vector_impl_data._M_start)->_vptr_IHeap[1])();
      iVar3 = (*(*local_13f8.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
                  super__Vector_impl_data._M_start)->_vptr_IHeap[1])();
      local_1438[0] = (internal)(iVar2 == iVar3);
      local_1430.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_1438[0]) {
        testing::Message::Message((Message *)&local_1440);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_1420,local_1438,(AssertionResult *)"tested.GetMin(0) == fool.GetMin(0)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1400,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/edgarshmavonyan[P]mergeable_heaps/unit_test.cpp"
                   ,0x1d,local_1420._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_1400,(Message *)&local_1440);
        testing::internal::AssertHelper::~AssertHelper(&local_1400);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1420._M_dataplus._M_p != &local_1420.field_2) {
          operator_delete(local_1420._M_dataplus._M_p);
        }
        if (local_1440.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_1440.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_1440.ptr_ + 8))();
          }
          local_1440.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_1430,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 1000000);
    iVar2 = 1000000;
    do {
      iVar3 = HeapList::ExtractMin(&local_13d8,0);
      iVar4 = HeapList::ExtractMin(&local_13f8,0);
      local_1438[0] = (internal)(iVar3 == iVar4);
      local_1430.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_1438[0]) {
        testing::Message::Message((Message *)&local_1440);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_1420,local_1438,
                   (AssertionResult *)"tested.ExtractMin(0) == fool.ExtractMin(0)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1400,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/edgarshmavonyan[P]mergeable_heaps/unit_test.cpp"
                   ,0x21,local_1420._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_1400,(Message *)&local_1440);
        testing::internal::AssertHelper::~AssertHelper(&local_1400);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1420._M_dataplus._M_p != &local_1420.field_2) {
          operator_delete(local_1420._M_dataplus._M_p);
        }
        if (local_1440.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_1440.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_1440.ptr_ + 8))();
          }
          local_1440.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_1430,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    HeapList::~HeapList(&local_13f8);
    HeapList::~HeapList(&local_13d8);
    HVar8 = local_1424 + Leftist;
  } while (HVar8 != Fool);
  operator_delete(__s);
  return;
}

Assistant:

TEST(UniversalTest, SingleUniversal_Test) {
    std::mt19937 generator(time(0));
    const size_t size = 1000000;
    std::vector<int> values(size);
    for (int i = 0; i < size; i++) {
        values[i] = generator();
    }

    for (int type = 0; type < 3; type++) {
        HeapList tested(type);
        FoolHeapList fool;

        tested.AddHeap(values[0]);
        fool.AddHeap(values[0]);
        std::cout << "Size " << size << std::endl;

        for (int i = 0; i < size - 1; i++) {
            tested.Insert(0, values[i + 1]);
            fool.Insert(0, values[i + 1]);
            EXPECT_TRUE(tested.GetMin(0) == fool.GetMin(0));
        }

        for (int i = 0; i < size; i++) {
            EXPECT_TRUE(tested.ExtractMin(0) == fool.ExtractMin(0));
        }
    }
}